

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void concept_const_suite::iterator_incrementable(void)

{
  bool bVar1;
  iterator_type *this;
  initializer_list<int> __l;
  const_iterator a;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  const_iterator local_28;
  
  span.member.data = (pointer)0x160000000b;
  span.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&data,__l,(allocator_type *)&a);
  span.member.data = (pointer)0x0;
  if ((long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.member.data =
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
  }
  span.member.cap =
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  span.member.size = span.member.cap;
  span.member.next = span.member.cap;
  a = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  this = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator++
                   (&a);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    (this,&a);
  boost::detail::test_impl
            ("b == a",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x178,"void concept_const_suite::iterator_incrementable()",bVar1);
  local_28 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator!=
                    (this,&local_28);
  boost::detail::test_impl
            ("b != span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x179,"void concept_const_suite::iterator_incrementable()",bVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void iterator_incrementable()
{
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::const_iterator a = span.begin();
    circular_view<int>::const_iterator& b = ++a;
    BOOST_TEST(b == a);
    BOOST_TEST(b != span.begin());
}